

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O2

int * Kit_TruthTest(char *pFileName)

{
  int iVar1;
  uint nVars;
  abctime aVar2;
  uint *pArray;
  int *piVar3;
  abctime aVar4;
  int iVar5;
  ulong uVar6;
  
  aVar2 = Abc_Clock();
  iVar1 = Extra_FileSize(pFileName);
  nVars = Kit_TruthFindVarNum(pFileName);
  iVar5 = 1 << ((char)nVars - 5U & 0x1f);
  if ((int)nVars < 6) {
    iVar5 = 1;
  }
  uVar6 = (long)((ulong)(uint)((int)((long)iVar1 / 4) >> 0x1f) << 0x20 |
                (long)iVar1 / 4 & 0xffffffffU) / (long)iVar5;
  pArray = (uint *)Extra_FileReadContents(pFileName);
  piVar3 = Kit_TruthStatsArray(pArray,nVars,(int)uVar6);
  iVar5 = 0x82b56d;
  printf("Finished proceessing %d functions with %d variables. ",uVar6 & 0xffffffff,(ulong)nVars);
  aVar4 = Abc_Clock();
  Abc_Print(iVar5,"%s =","Time");
  Abc_Print(iVar5,"%9.2f sec\n",(double)(aVar4 - aVar2) / 1000000.0);
  free(pArray);
  for (uVar6 = 0; uVar6 != 5; uVar6 = uVar6 + 1) {
    printf("Function %3d :  AND2 = %3d  Lev = %3d\n",uVar6 & 0xffffffff,
           (ulong)(piVar3[uVar6] & 0xffff),(ulong)(uint)(piVar3[uVar6] >> 0x10));
  }
  return piVar3;
}

Assistant:

int * Kit_TruthTest( char * pFileName )
{
    abctime clk   = Abc_Clock(); int i;
    int nFileSize = Extra_FileSize( pFileName );
    int nVars     = Kit_TruthFindVarNum( pFileName );
    int nFuncs    = nFileSize / 4 / Abc_TruthWordNum(nVars);
    unsigned * pA = (unsigned *)Extra_FileReadContents( pFileName );
    int * pResult = Kit_TruthStatsArray( pA, nVars, nFuncs );
    printf( "Finished proceessing %d functions with %d variables. ", nFuncs, nVars );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    ABC_FREE( pA );
    for ( i = 0; i < 5; i++ )
        printf( "Function %3d :  AND2 = %3d  Lev = %3d\n", i, pResult[i] & 0xFFFF, pResult[i] >> 16 );
    return pResult;
}